

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_common_keywords.cpp
# Opt level: O0

PGScanKeyword *
duckdb_libpgquery::ScanKeywordLookup(char *text,PGScanKeyword *keywords,int num_keywords)

{
  undefined1 auVar1 [16];
  int iVar2;
  size_t sVar3;
  pointer __s2;
  int in_EDX;
  PGScanKeyword *in_RSI;
  char *in_RDI;
  ulong uVar4;
  int difference;
  PGScanKeyword *middle;
  char ch;
  pointer word;
  unique_ptr<char[],_std::default_delete<char[]>_> data;
  PGScanKeyword *high;
  PGScanKeyword *low;
  int i;
  int len;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char local_49;
  PGScanKeyword *local_38;
  PGScanKeyword *local_30;
  int local_24;
  PGScanKeyword *local_8;
  
  sVar3 = strlen(in_RDI);
  iVar2 = (int)sVar3;
  uVar4 = (ulong)(iVar2 + 1);
  if ((long)uVar4 < 0) {
    uVar4 = 0xffffffffffffffff;
  }
  operator_new__(uVar4);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  __s2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                   ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
    local_49 = in_RDI[local_24];
    if (('@' < local_49) && (local_49 < '[')) {
      local_49 = local_49 + ' ';
    }
    __s2[local_24] = local_49;
  }
  __s2[iVar2] = '\0';
  local_38 = in_RSI + (in_EDX + -1);
  local_30 = in_RSI;
  while (local_30 <= local_38) {
    auVar1._8_8_ = (long)local_38 - (long)local_30 >> 0x3f;
    auVar1._0_8_ = (long)local_38 - (long)local_30 >> 4;
    local_8 = local_30 + SUB168(auVar1 / SEXT816(2),0);
    in_stack_ffffffffffffffa4 = strcmp(local_8->name,__s2);
    if (in_stack_ffffffffffffffa4 == 0) goto LAB_025f5033;
    if (in_stack_ffffffffffffffa4 < 0) {
      local_30 = local_8 + 1;
    }
    else {
      local_38 = local_8 + -1;
    }
  }
  local_8 = (PGScanKeyword *)0x0;
LAB_025f5033:
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,1));
  return local_8;
}

Assistant:

const PGScanKeyword *ScanKeywordLookup(const char *text, const PGScanKeyword *keywords, int num_keywords) {
	int len, i;
	const PGScanKeyword *low;
	const PGScanKeyword *high;

	len = strlen(text);
	auto data = std::unique_ptr<char[]>(new char[len + 1]);
	auto word = data.get();
	/* We assume all keywords are shorter than NAMEDATALEN. */

	/*
	 * Apply an ASCII-only downcasing.  We must not use tolower() since it may
	 * produce the wrong translation in some locales (eg, Turkish).
	 */
	for (i = 0; i < len; i++) {
		char ch = text[i];

		if (ch >= 'A' && ch <= 'Z')
			ch += 'a' - 'A';
		word[i] = ch;
	}
	word[len] = '\0';

	/*
	 * Now do a binary search using plain strcmp() comparison.
	 */
	low = keywords;
	high = keywords + (num_keywords - 1);
	while (low <= high) {
		const PGScanKeyword *middle;
		int difference;

		middle = low + (high - low) / 2;
		difference = strcmp(middle->name, word);
		if (difference == 0)
			return middle;
		else if (difference < 0)
			low = middle + 1;
		else
			high = middle - 1;
	}

	return NULL;
}